

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_kernel_2.h
# Opt level: O0

int __thiscall
dlib::sequence_kernel_2<dlib::document_handler_*,_dlib::memory_manager_stateless_kernel_1<char>_>::
remove(sequence_kernel_2<dlib::document_handler_*,_dlib::memory_manager_stateless_kernel_1<char>_>
       *this,char *__filename)

{
  node *pnVar1;
  node *pnVar2;
  int iVar3;
  node *temp;
  node *c_node;
  document_handler **in_stack_ffffffffffffffd0;
  
  move_to_pos(this,&this->current_node,&this->current_pos,(unsigned_long)__filename,
              this->sequence_size);
  pnVar1 = this->current_node;
  exchange<dlib::document_handler*>(in_stack_ffffffffffffffd0,(document_handler **)this);
  pnVar2 = this->current_node;
  pnVar1->left->right = pnVar1->right;
  pnVar1->right->left = pnVar1->left;
  this->current_node = pnVar1->right;
  this->sequence_size = this->sequence_size - 1;
  if (pnVar2 != (node *)0x0) {
    operator_delete(pnVar2);
  }
  iVar3 = (*(this->super_enumerable<dlib::document_handler_*>)._vptr_enumerable[3])();
  return iVar3;
}

Assistant:

void sequence_kernel_2<T,mem_manager>::
    remove (
        unsigned long pos,
        T& item
    )
    {
        move_to_pos(current_node,current_pos,pos,sequence_size);
        node& c_node = *current_node;
        exchange(c_node.item,item);
        
        node* temp = current_node;
        
        // close up gap left by remove
        c_node.left->right = c_node.right;
        c_node.right->left = c_node.left;

        current_node = c_node.right;

        --sequence_size;

        delete temp;
        // reset the enumerator
        reset();
    }